

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetFrameworkVersion_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  TargetType TVar1;
  cmValue cVar2;
  allocator<char> local_39;
  string local_38;
  
  TVar1 = GetType(this);
  if (TVar1 == INTERFACE_LIBRARY) {
    __assert_fail("this->GetType() != cmStateEnums::INTERFACE_LIBRARY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x19fa,"std::string cmGeneratorTarget::GetFrameworkVersion() const");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"FRAMEWORK_VERSION",&local_39);
  cVar2 = GetProperty(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (cVar2.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"VERSION",&local_39);
    cVar2 = GetProperty(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (cVar2.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"A",(allocator<char> *)&local_38);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)cVar2.Value);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFrameworkVersion() const
{
  assert(this->GetType() != cmStateEnums::INTERFACE_LIBRARY);

  if (cmValue fversion = this->GetProperty("FRAMEWORK_VERSION")) {
    return *fversion;
  }
  if (cmValue tversion = this->GetProperty("VERSION")) {
    return *tversion;
  }
  return "A";
}